

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::mouseMoveEvent(Picker *this,QMouseEvent *event)

{
  int iVar1;
  int iVar2;
  PickerPrivate *pPVar3;
  QPoint __addr_len;
  sockaddr *__addr;
  int __fd;
  QPoint local_24;
  int local_1c;
  QMouseEvent *pQStack_18;
  int delta;
  QMouseEvent *event_local;
  Picker *this_local;
  
  __fd = (int)event;
  pQStack_18 = event;
  event_local = (QMouseEvent *)this;
  pPVar3 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  if ((pPVar3->leftMouseButtonPressed & 1U) == 0) {
    QEvent::ignore((QEvent *)pQStack_18);
  }
  else {
    pPVar3 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar3->mouseWasMoved = true;
    local_24 = QMouseEvent::pos(pQStack_18);
    iVar1 = QPoint::y(&local_24);
    pPVar3 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    local_1c = QPoint::y(&pPVar3->mousePos);
    local_1c = iVar1 - local_1c;
    iVar2 = qAbs<int>(&local_1c);
    pPVar3 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    iVar1 = local_1c;
    pPVar3->mouseMoveDelta = iVar2 + pPVar3->mouseMoveDelta;
    pPVar3 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar3->drawItemOffset = iVar1 + pPVar3->drawItemOffset;
    __addr_len = QMouseEvent::pos(pQStack_18);
    pPVar3 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar3->mousePos = __addr_len;
    QWidget::update();
    QEvent::accept((QEvent *)pQStack_18,__fd,__addr,(socklen_t *)__addr_len);
  }
  return;
}

Assistant:

void
Picker::mouseMoveEvent( QMouseEvent * event )
{
	if( d->leftMouseButtonPressed )
	{
		d->mouseWasMoved = true;

		const int delta = event->pos().y() - d->mousePos.y();
		d->mouseMoveDelta += qAbs( delta );
		d->drawItemOffset += delta;
		d->mousePos = event->pos();
		update();

		event->accept();
	}
	else
		event->ignore();
}